

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O3

size_t strftime(char *__s,size_t __maxsize,char *__format,tm *__tp)

{
  ulong uVar1;
  long lVar2;
  div_t dVar3;
  div_t dVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  
  if (__maxsize != 0) {
    uVar1 = __maxsize - 2;
    uVar7 = 0;
    do {
      cVar6 = *__format;
      if (cVar6 != '%') {
        __s[uVar7] = cVar6;
        if (cVar6 == '\0') {
          return uVar7;
        }
        __format = __format + 1;
        goto LAB_0010a6df;
      }
      pcVar8 = __format + 1;
      __format = __format + 2;
      switch(*pcVar8) {
      case '%':
        __s[uVar7] = '%';
        goto LAB_0010a6df;
      default:
        goto switchD_0010a6ab_caseD_26;
      case 'A':
        if ((ulong)(uint)__tp->tm_wday < 7) {
          pcVar8 = _PDCLIB_lc_time->day_name_full[(uint)__tp->tm_wday];
        }
        else {
LAB_0010aa5c:
          pcVar8 = "?";
        }
        goto LAB_0010aa63;
      case 'B':
        if (0xb < (ulong)(uint)__tp->tm_mon) goto LAB_0010aa5c;
        pcVar8 = _PDCLIB_lc_time->month_name_full[(uint)__tp->tm_mon];
        goto LAB_0010aa63;
      case 'C':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = (__tp->tm_year + 0x76c) / 100;
        break;
      case 'D':
        sVar10 = __maxsize - uVar7;
        pcVar8 = "%m/%d/%y";
        goto LAB_0010ab2d;
      case 'F':
        sVar10 = __maxsize - uVar7;
        pcVar8 = "%Y-%m-%d";
        goto LAB_0010ab2d;
      case 'G':
        if (__maxsize - 4 <= uVar7) {
          return 0;
        }
        dVar3.quot = week_calc((tm *)__tp,3);
        dVar3.rem = 0;
        lVar2 = 4;
        do {
          dVar3 = div(dVar3.quot,10);
          __s[lVar2 + (uVar7 - 1)] = (char)dVar3.rem + '0';
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
        goto LAB_0010aaec;
      case 'H':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_hour;
        break;
      case 'I':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_hour + 0xb;
        iVar5 = iVar11 >> 0x1f;
        iVar11 = __tp->tm_hour + (((uint)(iVar11 / 6 + iVar5) >> 1) - iVar5) * -0xc + 0xc;
        break;
      case 'M':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_min;
        break;
      case 'R':
        sVar10 = __maxsize - uVar7;
        pcVar8 = "%H:%M";
        goto LAB_0010ab2d;
      case 'S':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_sec;
        break;
      case 'T':
        sVar10 = __maxsize - uVar7;
        pcVar8 = "%H:%M:%S";
        goto LAB_0010ab2d;
      case 'U':
        if (uVar1 <= uVar7) {
          return 0;
        }
        dVar4 = div(__tp->tm_yday,7);
        iVar5 = dVar4.rem;
        iVar11 = __tp->tm_wday;
        iVar9 = (int)((ulong)((long)(iVar11 + 7) * -0x6db6db6d) >> 0x20) + iVar11 + 7;
        iVar11 = iVar11 + ((iVar9 >> 2) - (iVar9 >> 0x1f)) * -7 + 7;
        goto LAB_0010abc3;
      case 'V':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = week_calc((tm *)__tp,2);
        break;
      case 'W':
        if (uVar1 <= uVar7) {
          return 0;
        }
        dVar4 = div(__tp->tm_yday,7);
        iVar5 = dVar4.rem;
        iVar11 = __tp->tm_wday;
        iVar9 = (int)((ulong)((long)(iVar11 + 6) * -0x6db6db6d) >> 0x20) + iVar11 + 6;
        iVar11 = iVar11 + ((iVar9 >> 2) - (iVar9 >> 0x1f)) * -7 + 6;
LAB_0010abc3:
        iVar11 = (uint)(iVar11 <= iVar5) + dVar4.quot;
        break;
      case 'X':
        sVar10 = __maxsize - uVar7;
        pcVar8 = _PDCLIB_lc_time->time_format;
        goto LAB_0010ab2d;
      case 'Y':
        if (__maxsize - 4 <= uVar7) {
          return 0;
        }
        dVar4.quot = __tp->tm_year + 0x76c;
        dVar4.rem = 0;
        lVar2 = 4;
        do {
          dVar4 = div(dVar4.quot,10);
          __s[lVar2 + (uVar7 - 1)] = (char)dVar4.rem + '0';
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
LAB_0010aaec:
        uVar7 = uVar7 + 4;
        goto switchD_0010a6ab_caseD_26;
      case 'a':
        if (6 < (ulong)(uint)__tp->tm_wday) goto LAB_0010aa5c;
        pcVar8 = _PDCLIB_lc_time->day_name_abbr[(uint)__tp->tm_wday];
        goto LAB_0010aa63;
      case 'b':
      case 'h':
        if (0xb < (ulong)(uint)__tp->tm_mon) goto LAB_0010aa5c;
        pcVar8 = _PDCLIB_lc_time->month_name_abbr[(uint)__tp->tm_mon];
        goto LAB_0010aa63;
      case 'c':
        sVar10 = __maxsize - uVar7;
        pcVar8 = _PDCLIB_lc_time->date_time_format;
        goto LAB_0010ab2d;
      case 'd':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_mday;
        break;
      case 'e':
        if (uVar1 <= uVar7) {
          return 0;
        }
        dVar4 = div(__tp->tm_mday,10);
        cVar6 = ' ';
        if (0 < dVar4.quot) {
          cVar6 = (char)dVar4.quot + '0';
        }
        __s[uVar7] = cVar6;
        __s[uVar7 + 1] = (char)dVar4.rem + '0';
        goto LAB_0010ac02;
      case 'g':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = week_calc((tm *)__tp,3);
        goto LAB_0010ab53;
      case 'j':
        if (__maxsize - 3 <= uVar7) {
          return 0;
        }
        dVar4 = div(__tp->tm_yday + 1,100);
        __s[uVar7] = (char)dVar4.quot + '0';
        lVar2 = ((long)dVar4 >> 0x20) * 0x66666667;
        cVar6 = (char)(int)(lVar2 >> 0x22) - (char)(lVar2 >> 0x3f);
        __s[uVar7 + 1] = cVar6 + '0';
        __s[uVar7 + 2] = (char)dVar4.rem + cVar6 * -10 + '0';
        uVar7 = uVar7 + 3;
        goto switchD_0010a6ab_caseD_26;
      case 'm':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_mon + 1;
        break;
      case 'n':
        __s[uVar7] = '\n';
        goto LAB_0010a6df;
      case 'p':
        pcVar8 = _PDCLIB_lc_time->am_pm[0xb < __tp->tm_hour];
LAB_0010aa63:
        sVar10 = strlen(pcVar8);
        if (__maxsize - sVar10 <= uVar7) {
          return 0;
        }
        strcpy(__s + uVar7,pcVar8);
        uVar7 = uVar7 + sVar10;
        goto switchD_0010a6ab_caseD_26;
      case 'r':
        sVar10 = __maxsize - uVar7;
        pcVar8 = _PDCLIB_lc_time->time_format_12h;
        goto LAB_0010ab2d;
      case 't':
        __s[uVar7] = '\t';
        goto LAB_0010a6df;
      case 'u':
        cVar6 = '7';
        if (__tp->tm_wday != 0) {
          cVar6 = (char)__tp->tm_wday + '0';
        }
        __s[uVar7] = cVar6;
        goto LAB_0010a6df;
      case 'w':
        __s[uVar7] = (char)__tp->tm_wday + '0';
LAB_0010a6df:
        uVar7 = uVar7 + 1;
        goto switchD_0010a6ab_caseD_26;
      case 'x':
        sVar10 = __maxsize - uVar7;
        pcVar8 = _PDCLIB_lc_time->date_format;
LAB_0010ab2d:
        sVar10 = strftime(__s + uVar7,sVar10,pcVar8,__tp);
        if (sVar10 == 0) {
          return 0;
        }
        uVar7 = uVar7 + sVar10;
        goto switchD_0010a6ab_caseD_26;
      case 'y':
        if (uVar1 <= uVar7) {
          return 0;
        }
        iVar11 = __tp->tm_year;
LAB_0010ab53:
        iVar11 = iVar11 % 100;
      }
      dVar4 = div(iVar11,10);
      __s[uVar7] = (char)dVar4.quot + '0';
      __s[uVar7 + 1] = (char)dVar4.rem + '0';
LAB_0010ac02:
      uVar7 = uVar7 + 2;
switchD_0010a6ab_caseD_26:
    } while (uVar7 < __maxsize);
  }
  return 0;
}

Assistant:

size_t strftime( char * _PDCLIB_restrict s, size_t maxsize, const char * _PDCLIB_restrict format, const struct tm * _PDCLIB_restrict timeptr )
{
    size_t rc = 0;

    while ( rc < maxsize )
    {
        if ( *format != '%' )
        {
            if ( ( s[rc] = *format++ ) == '\0' )
            {
                return rc;
            }
            else
            {
                ++rc;
            }
        }
        else
        {
            /* char flag = 0; */
            switch ( *++format )
            {
                case 'E':
                case 'O':
                    /* flag = *format++; */
                    break;

                default:
                    /* EMPTY */
                    break;
            }

            switch ( *format++ )
            {
                case 'a':
                {
                    /* tm_wday abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_abbr, timeptr->tm_wday, 6 );
                    break;
                }

                case 'A':
                {
                    /* tm_wday full */
                    SPRINTSTR( _PDCLIB_lc_time->day_name_full, timeptr->tm_wday, 6 );
                    break;
                }

                case 'b':
                case 'h':
                {
                    /* tm_mon abbreviated */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_abbr, timeptr->tm_mon, 11 );
                    break;
                }

                case 'B':
                {
                    /* tm_mon full */
                    SPRINTSTR( _PDCLIB_lc_time->month_name_full, timeptr->tm_mon, 11 );
                    break;
                }

                case 'c':
                {
                    /* locale's date / time representation, %a %b %e %T %Y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_time_format );
                    break;
                }

                case 'C':
                {
                    /* tm_year divided by 100, truncated to decimal (00-99) */
                    /* 'E' for base year (period) in locale's alternative representation */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t period = div( ( ( timeptr->tm_year + 1900 ) / 100 ), 10 );
                        s[rc++] = '0' + period.quot;
                        s[rc++] = '0' + period.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'd':
                {
                    /* tm_mday as decimal (01-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = '0' + day.quot;
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'D':
                {
                    /* %m/%d/%y */
                    SPRINTREC( "%m/%d/%y" );
                    break;
                }

                case 'e':
                {
                    /* tm_mday as decimal ( 1-31) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t day = div( timeptr->tm_mday, 10 );
                        s[rc++] = ( day.quot > 0 ) ? '0' + day.quot : ' ';
                        s[rc++] = '0' + day.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'F':
                {
                    /* %Y-%m-%d */
                    SPRINTREC( "%Y-%m-%d" );
                    break;
                }

                case 'g':
                {
                    /* last 2 digits of the week-based year as decimal (00-99) */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( week_calc( timeptr, E_ISO_YEAR ) % 100, 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'G':
                {
                    /* week-based year as decimal (e.g. 1997) */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = week_calc( timeptr, E_ISO_YEAR );
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'H':
                {
                    /* tm_hour as 24h decimal (00-23) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( timeptr->tm_hour, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'I':
                {
                    /* tm_hour as 12h decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t hour = div( ( timeptr->tm_hour + 11 ) % 12 + 1, 10 );
                        s[rc++] = '0' + hour.quot;
                        s[rc++] = '0' + hour.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'j':
                {
                    /* tm_yday as decimal (001-366) */
                    if ( rc < ( maxsize - 3 ) )
                    {
                        div_t yday = div( timeptr->tm_yday + 1, 100 );
                        s[rc++] = '0' + yday.quot;
                        s[rc++] = '0' + yday.rem / 10;
                        s[rc++] = '0' + yday.rem % 10;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'm':
                {
                    /* tm_mon as decimal (01-12) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t mon = div( timeptr->tm_mon + 1, 10 );
                        s[rc++] = '0' + mon.quot;
                        s[rc++] = '0' + mon.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'M':
                {
                    /* tm_min as decimal (00-59) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t min = div( timeptr->tm_min, 10 );
                        s[rc++] = '0' + min.quot;
                        s[rc++] = '0' + min.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'n':
                {
                    /* newline */
                    s[rc++] = '\n';
                    break;
                }

                case 'p':
                {
                    /* tm_hour locale's AM/PM designations */
                    SPRINTSTR( _PDCLIB_lc_time->am_pm, timeptr->tm_hour > 11, 1 );
                    break;
                }

                case 'r':
                {
                    /* tm_hour / tm_min / tm_sec as locale's 12-hour clock time, %I:%M:%S %p for C locale */
                    SPRINTREC( _PDCLIB_lc_time->time_format_12h );
                    break;
                }

                case 'R':
                {
                    /* %H:%M */
                    SPRINTREC( "%H:%M" );
                    break;
                }

                case 'S':
                {
                    /* tm_sec as decimal (00-60) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t sec = div( timeptr->tm_sec, 10 );
                        s[rc++] = '0' + sec.quot;
                        s[rc++] = '0' + sec.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 't':
                {
                    /* tabulator */
                    s[rc++] = '\t';
                    break;
                }

                case 'T':
                {
                    /* %H:%M:%S */
                    SPRINTREC( "%H:%M:%S" );
                    break;
                }

                case 'u':
                {
                    /* tm_wday as decimal (1-7) with Monday == 1 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = ( timeptr->tm_wday == 0 ) ? '7' : '0' + timeptr->tm_wday;
                    break;
                }

                case 'U':
                {
                    /* week number of the year (first Sunday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_SUNDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'V':
                {
                    /* ISO week number as decimal (01-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_ISO_WEEK ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'w':
                {
                    /* tm_wday as decimal number (0-6) with Sunday == 0 */
                    /* 'O' for locale's alternative numeric symbols */
                    s[rc++] = '0' + timeptr->tm_wday;
                    break;
                }

                case 'W':
                {
                    /* week number of the year (first Monday as the first day of week 1) as decimal (00-53) */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t week = div( week_calc( timeptr, E_MONDAY ), 10 );
                        s[rc++] = '0' + week.quot;
                        s[rc++] = '0' + week.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'x':
                {
                    /* locale's date representation, %m/%d/%y for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->date_format );
                    break;
                }

                case 'X':
                {
                    /* locale's time representation, %T for C locale */
                    /* 'E' for locale's alternative representation */
                    SPRINTREC( _PDCLIB_lc_time->time_format );
                    break;
                }

                case 'y':
                {
                    /* last 2 digits of tm_year as decimal (00-99) */
                    /* 'E' for offset from %EC (year only) in locale's alternative representation */
                    /* 'O' for locale's alternative numeric symbols */
                    if ( rc < ( maxsize - 2 ) )
                    {
                        div_t year = div( ( timeptr->tm_year % 100 ), 10 );
                        s[rc++] = '0' + year.quot;
                        s[rc++] = '0' + year.rem;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'Y':
                {
                    /* tm_year as decimal (e.g. 1997) */
                    /* 'E' for locale's alternative representation */
                    if ( rc < ( maxsize - 4 ) )
                    {
                        int year = timeptr->tm_year + 1900;
                        int i;

                        for ( i = 3; i >= 0; --i )
                        {
                            div_t digit = div( year, 10 );
                            s[ rc + i ] = '0' + digit.rem;
                            year = digit.quot;
                        }

                        rc += 4;
                    }
                    else
                    {
                        return 0;
                    }

                    break;
                }

                case 'z':
                {
                    /* tm_isdst / UTC offset in ISO8601 format (e.g. -0430 meaning 4 hours 30 minutes behind Greenwich), or no characters */
                    /* TODO: 'z' */
                    break;
                }

                case 'Z':
                {
                    /* tm_isdst / locale's time zone name or abbreviation, or no characters */
                    /* TODO: 'Z' */
                    break;
                }

                case '%':
                {
                    /* '%' character */
                    s[rc++] = '%';
                    break;
                }
            }
        }
    }

    return 0;
}